

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O1

void polymul_internal::taylor_inplace_multiplier<double,_4,_2,_5,_1>::mul(double *p1,double *p2)

{
  int iVar1;
  
  iVar1 = binomial(5,1);
  polynomial_multiplier<double,_3,_1,_0>::mul(p1 + iVar1,p1 + 1,p2 + 1);
  polynomial_multiplier<double,_3,_1,_1>::mul_monomial(p1 + iVar1,p1 + 1,p2 + 2);
  taylor_inplace_multiplier<double,_4,_2,_5,_2>::mul(p1,p2);
  return;
}

Assistant:

static void mul(numtype p1[], const numtype p2[]) {
    if (i2 <= Ndeg2) {
      // M1(Ndeg-i2)*M2(i2) -> M1(Ndeg)
      polynomial_multiplier<numtype, Nvar - 1, Ndeg - i2, i2>::mul(
          p1 + binomial(Nvar + Ndeg - 1, Ndeg - 1),
          p1 + binomial(Nvar + Ndeg - i2 - 1, Ndeg - i2 - 1),
          p2 + binomial(Nvar + i2 - 1, i2 - 1));
    }
    taylor_inplace_multiplier<numtype, Nvar, Ndeg, Ndeg2, i2 + 1> // Back to (2), or
                                                                  // to (3) when i2+1
                                                                  // == Ndeg
        ::mul(p1, p2);
  }